

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFun.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  string string2;
  string string1;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_60 = 0;
  local_58 = 0;
  local_80 = 0;
  local_78 = 0;
  local_88 = &local_78;
  local_68 = &local_58;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter two strings.",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"String 1: ",10);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'x');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_68,cVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"String 2: ",10);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'x');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_88,cVar1);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_68,local_68 + local_60);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_88 + local_80);
  if (local_a0 == local_40) {
    if (local_a0 == 0) {
      bVar4 = true;
    }
    else {
      lVar2 = 0;
      do {
        bVar4 = *(char *)((long)local_a8 + lVar2) == *(char *)((long)local_48 + lVar2);
        if (!bVar4) break;
        bVar5 = local_a0 + -1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar5);
    }
  }
  else {
    bVar4 = false;
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  pcVar3 = "The strings are different.";
  if (bVar4 != false) {
    pcVar3 = "The strings are the same.";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar3,0x1a - (ulong)bVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return 0;
}

Assistant:

int main()
{
    string string1;
    string string2;

    cout << "Enter two strings." << endl;
    cout << "String 1: ";
    getline(cin, string1);
    cout << "String 2: ";
    getline(cin, string2);

    bool same = StrComp(string1, string2);

    if(same)
    {
        cout << "The strings are the same." << endl;
    }
    else
    {
        cout << "The strings are different." << endl;
    }

    return 0;
}